

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::jpg_message_handler(j_common_ptr param_1,int msg_level)

{
  Exception *this;
  allocator local_39;
  string local_38 [36];
  int local_14;
  j_common_ptr pjStack_10;
  int msg_level_local;
  j_common_ptr param_0_local;
  
  if (msg_level < 0) {
    local_14 = msg_level;
    pjStack_10 = param_1;
    this = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"JPEG data corrupt",&local_39);
    util::Exception::Exception(this,(string *)local_38);
    __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  return;
}

Assistant:

void
jpg_message_handler (j_common_ptr /*cinfo*/, int msg_level)
{
    if (msg_level < 0)
        throw util::Exception("JPEG data corrupt");
}